

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SurfaceMesh::generateVertexIterationCache
          (SurfaceMesh *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *vertexIterationCacheHeIndex,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *vertexIterationCacheVertexStart,
          bool incoming,bool skipDead)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  byte in_CL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  byte in_R8B;
  size_t entryInd;
  size_t iV_2;
  size_t iHe_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currVertexCacheEntry;
  size_t iV_1;
  size_t heSum;
  size_t iV;
  size_t iHe;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vDegree;
  ulong in_stack_fffffffffffffed8;
  SurfaceMesh *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffee8;
  SurfaceMesh *__n;
  SurfaceMesh *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  ulong local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  ulong local_78;
  value_type local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  ulong local_60;
  undefined8 local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  byte local_1a;
  byte local_19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_40 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x232e0c);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,(value_type_conflict *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x232e3a);
  for (local_60 = 0; local_60 < *(ulong *)(in_RDI + 0x2c0); local_60 = local_60 + 1) {
    if (((local_1a & 1) == 0) ||
       (bVar2 = halfedgeIsDead(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8), !bVar2)) {
      if ((local_19 & 1) == 0) {
        local_e0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   heVertex(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
      else {
        in_stack_ffffffffffffff30 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             heNext(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        local_e0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   heVertex(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        in_stack_ffffffffffffff28 = local_e0;
      }
      local_68 = local_e0;
      pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_38,(size_type)local_e0);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  local_70 = 0;
  for (local_78 = 0; vVar1 = local_70, local_78 < *(ulong *)(in_RDI + 0x2b8);
      local_78 = local_78 + 1) {
    pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_18,local_78);
    *pvVar3 = vVar1;
    pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_38,local_78);
    local_70 = *pvVar3 + local_70;
  }
  pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (local_18,*(size_type *)(in_RDI + 0x2b8));
  *pvVar3 = vVar1;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  for (local_98 = 0; local_98 < *(ulong *)(in_RDI + 0x2c0); local_98 = local_98 + 1) {
    if (((local_1a & 1) == 0) ||
       (bVar2 = halfedgeIsDead(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8), !bVar2)) {
      if ((local_19 & 1) == 0) {
        in_stack_fffffffffffffee0 =
             (SurfaceMesh *)heVertex(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        __n = in_stack_fffffffffffffee0;
      }
      else {
        heNext(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        in_stack_fffffffffffffef0 =
             (SurfaceMesh *)heVertex(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        __n = in_stack_fffffffffffffef0;
      }
      pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_90,(size_type)__n);
      in_stack_fffffffffffffed8 = local_98;
      pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_10,*pvVar3);
      *pvVar3 = in_stack_fffffffffffffed8;
      pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_90,(size_type)__n);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffef0);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void SurfaceMesh::generateVertexIterationCache(std::vector<size_t>& vertexIterationCacheHeIndex,
                                               std::vector<size_t>& vertexIterationCacheVertexStart, bool incoming,
                                               bool skipDead) {

  // First, count the degree of every vertex
  std::vector<size_t> vDegree(nVerticesFillCount, 0);
  for (size_t iHe = 0; iHe < nHalfedgesFillCount; iHe++) {
    if (skipDead && halfedgeIsDead(iHe)) continue;
    size_t iV = incoming ? heVertex(heNext(iHe)) : heVertex(iHe);
    vDegree[iV]++;
  }

  // Build a sum-array of the number of vertices up to that point
  vertexIterationCacheVertexStart.resize(nVerticesFillCount + 1);
  size_t heSum = 0;
  for (size_t iV = 0; iV < nVerticesFillCount; iV++) {
    vertexIterationCacheVertexStart[iV] = heSum;
    heSum += vDegree[iV];
  }
  // add one extra element, so we can check end bound by indexing+1
  vertexIterationCacheVertexStart[nVerticesFillCount] = heSum;

  // Build a compressed array of the halfedges at each vertex
  std::vector<size_t> currVertexCacheEntry = vertexIterationCacheVertexStart;
  vertexIterationCacheHeIndex.resize(nHalfedgesFillCount);
  for (size_t iHe = 0; iHe < nHalfedgesFillCount; iHe++) {
    if (skipDead && halfedgeIsDead(iHe)) continue;
    size_t iV = incoming ? heVertex(heNext(iHe)) : heVertex(iHe);
    size_t entryInd = currVertexCacheEntry[iV];
    vertexIterationCacheHeIndex[entryInd] = iHe;
    currVertexCacheEntry[iV]++;
  }
}